

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgvalfmt.c
# Opt level: O0

int mpt_msgvalfmt_typeid(uint8_t fmt)

{
  byte bVar1;
  size_t len;
  uint local_2c;
  ssize_t size;
  uint8_t fmt_local;
  
  if ((fmt & 0x80) == 0x80) {
    len = mpt_msgvalfmt_size(fmt);
    bVar1 = fmt & 0x60;
    if ((fmt & 0x60) == 0) {
      size._4_4_ = 0xfffffffd;
    }
    else {
      if (bVar1 == 0x20) {
        size._3_1_ = mpt_type_uint(len);
      }
      else {
        if (bVar1 == 0x40) {
          if (len == 4) {
            return 0x66;
          }
          if (len != 8) {
            if (len != 0x10) {
              return -3;
            }
            return 0x65;
          }
          return 100;
        }
        size._3_1_ = fmt;
        if (bVar1 == 0x60) {
          size._3_1_ = mpt_type_int(len);
        }
      }
      if (size._3_1_ == 0) {
        local_2c = 0xfffffffd;
      }
      else {
        local_2c = (uint)size._3_1_;
      }
      size._4_4_ = local_2c;
    }
  }
  else {
    size._4_4_ = 0xfffffffe;
  }
  return size._4_4_;
}

Assistant:

extern int mpt_msgvalfmt_typeid(uint8_t fmt)
{
	ssize_t size;
	/* value in wrong byte order */
	if ((fmt & MPT_MESGVAL(ByteOrderLittle)) != MPT_MESGVAL(ByteOrderNative)) {
		return MPT_ERROR(BadValue);
	}
	size = mpt_msgvalfmt_size(fmt);
	
	switch (fmt & MPT_MESGVAL(Normal)) {
	  /* no representation for big numbers */
	  case 0:
		return MPT_ERROR(BadType);
	  case MPT_MESGVAL(Integer):
		fmt = mpt_type_int(size);
		break;
	  case MPT_MESGVAL(Float):
		switch (size) {
		  case sizeof(float): return 'f';
		  case sizeof(double): return 'd';
		  case sizeof(long double): return 'e';
		  default: return MPT_ERROR(BadType);
		}
	  case MPT_MESGVAL(Unsigned):
		fmt = mpt_type_uint(size);
		break;
	}
	return fmt ? fmt : MPT_ERROR(BadType);
}